

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O1

amqp_socket_t * amqp_ssl_socket_new(amqp_connection_state_t state)

{
  bool bVar1;
  uint __errnum;
  int iVar2;
  amqp_socket_t *base;
  SSL_METHOD *meth;
  SSL_CTX *pSVar3;
  char *pcVar4;
  char *pcVar5;
  
  base = (amqp_socket_t *)calloc(1,0x30);
  if (base == (amqp_socket_t *)0x0) {
    return (amqp_socket_t *)0x0;
  }
  *(undefined4 *)&base[2].klass = 0xffffffff;
  base->klass = &amqp_ssl_socket_class;
  base[4].klass = (amqp_socket_class_t *)0x100000001;
  __errnum = pthread_mutex_lock((pthread_mutex_t *)&openssl_init_mutex);
  if (__errnum != 0) {
    pcVar4 = strerror(__errnum);
    pcVar5 = "pthread_mutex_lock(&openssl_init_mutex)";
    goto LAB_0010b7b3;
  }
  if (openssl_bio_initialized == '\0') {
    iVar2 = amqp_openssl_bio_init();
    if (iVar2 == 0) {
      openssl_bio_initialized = '\x01';
      goto LAB_0010b6e6;
    }
    bVar1 = false;
  }
  else {
LAB_0010b6e6:
    openssl_connections = openssl_connections + 1;
    bVar1 = true;
  }
  __errnum = pthread_mutex_unlock((pthread_mutex_t *)&openssl_init_mutex);
  if (__errnum == 0) {
    if (bVar1) {
      meth = (SSL_METHOD *)TLS_client_method();
      pSVar3 = SSL_CTX_new(meth);
      base[1].klass = (amqp_socket_class_t *)pSVar3;
      if ((pSVar3 != (SSL_CTX *)0x0) &&
         (iVar2 = amqp_ssl_socket_set_ssl_versions(base,AMQP_TLSv1_2,AMQP_TLSvLATEST), iVar2 == 0))
      {
        SSL_CTX_ctrl((SSL_CTX *)base[1].klass,0x21,1,(void *)0x0);
        SSL_CTX_ctrl((SSL_CTX *)base[1].klass,0x4e,4,(void *)0x0);
        amqp_set_socket(state,base);
        return base;
      }
    }
    amqp_ssl_socket_delete(base);
    return (amqp_socket_t *)0x0;
  }
  pcVar4 = strerror(__errnum);
  pcVar5 = "pthread_mutex_unlock(&openssl_init_mutex)";
LAB_0010b7b3:
  amqp_abort("Check %s failed <%d>: %s",pcVar5,(ulong)__errnum,pcVar4);
}

Assistant:

amqp_socket_t *amqp_ssl_socket_new(amqp_connection_state_t state) {
  struct amqp_ssl_socket_t *self = calloc(1, sizeof(*self));
  int status;
  if (!self) {
    return NULL;
  }

  self->sockfd = -1;
  self->klass = &amqp_ssl_socket_class;
  self->verify_peer = 1;
  self->verify_hostname = 1;

  status = initialize_ssl_and_increment_connections();
  if (status) {
    goto error;
  }

  self->ctx = SSL_CTX_new(TLS_client_method());
  if (!self->ctx) {
    goto error;
  }
  status = amqp_ssl_socket_set_ssl_versions((amqp_socket_t *)self, AMQP_TLSv1_2,
                                            AMQP_TLSvLATEST);
  if (status != AMQP_STATUS_OK) {
    goto error;
  }

  SSL_CTX_set_mode(self->ctx, SSL_MODE_ENABLE_PARTIAL_WRITE);
  /* OpenSSL v1.1.1 turns this on by default, which makes the non-blocking
   * logic not behave as expected, so turn this back off */
  SSL_CTX_clear_mode(self->ctx, SSL_MODE_AUTO_RETRY);

  amqp_set_socket(state, (amqp_socket_t *)self);

  return (amqp_socket_t *)self;
error:
  amqp_ssl_socket_delete((amqp_socket_t *)self);
  return NULL;
}